

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_object_impl.hpp
# Opt level: O0

void __thiscall
asio::detail::
io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>::
io_object_impl<asio::io_context>
          (io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>
           *this,int param_2,int param_3,io_context *context)

{
  service_registry *psVar1;
  basic_executor_type<std::allocator<void>,_0UL> *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  io_context *in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  constraint_t<conditional_t<_is_same<basic_executor_type<allocator<void>,_0UL>,_any_io_executor>::value_&&__is_base_of<execution::detail::any_executor_base,_basic_executor_type<allocator<void>,_0UL>_>::value,_execution::detail::is_valid_target_executor<basic_executor_type<allocator<void>,_0UL>,_supportable_properties_type>,_false_type>::value>
  in_stack_ffffffffffffffe4;
  
  psVar1 = (service_registry *)
           use_service<asio::detail::reactive_socket_service<asio::ip::udp>>((io_context *)0x3d5329)
  ;
  (in_RDI->super_execution_context).service_registry_ = psVar1;
  reactive_socket_service<asio::ip::udp>::implementation_type::implementation_type
            ((implementation_type *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  asio::io_context::get_executor(in_RDI);
  any_io_executor::
  any_io_executor<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>
            ((any_io_executor *)CONCAT44(in_ESI,in_EDX),in_RCX,in_stack_ffffffffffffffe4);
  asio::io_context::basic_executor_type<std::allocator<void>,_0UL>::~basic_executor_type
            ((basic_executor_type<std::allocator<void>,_0UL> *)&stack0xffffffffffffffe0);
  reactive_socket_service_base::construct
            ((reactive_socket_service_base *)
             &(((in_RDI->super_execution_context).service_registry_)->mutex_).mutex_.__data.__list.
              __next,(base_implementation_type *)&in_RDI->impl_);
  return;
}

Assistant:

explicit io_object_impl(int, int, ExecutionContext& context)
    : service_(&asio::use_service<IoObjectService>(context)),
      executor_(context.get_executor())
  {
    service_->construct(implementation_);
  }